

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jddctmgr.c
# Opt level: O0

void jinit_inverse_dct(j_decompress_ptr cinfo)

{
  jpeg_inverse_dct *pjVar1;
  void *pvVar2;
  jpeg_component_info *local_28;
  jpeg_component_info *compptr;
  int ci;
  my_idct_ptr idct;
  j_decompress_ptr cinfo_local;
  
  pjVar1 = (jpeg_inverse_dct *)(*cinfo->mem->alloc_small)((j_common_ptr)cinfo,1,0x80);
  cinfo->idct = pjVar1;
  pjVar1->start_pass = start_pass;
  compptr._4_4_ = 0;
  local_28 = cinfo->comp_info;
  for (; compptr._4_4_ < cinfo->num_components; compptr._4_4_ = compptr._4_4_ + 1) {
    pvVar2 = (*cinfo->mem->alloc_small)((j_common_ptr)cinfo,1,0x100);
    local_28->dct_table = pvVar2;
    memset(local_28->dct_table,0,0x100);
    *(undefined4 *)((long)pjVar1[1].inverse_DCT + (long)compptr._4_4_ * 4 + -8) = 0xffffffff;
    local_28 = local_28 + 1;
  }
  return;
}

Assistant:

GLOBAL(void)
jinit_inverse_dct (j_decompress_ptr cinfo)
{
  my_idct_ptr idct;
  int ci;
  jpeg_component_info *compptr;

  idct = (my_idct_ptr)
    (*cinfo->mem->alloc_small) ((j_common_ptr) cinfo, JPOOL_IMAGE,
				SIZEOF(my_idct_controller));
  cinfo->idct = (struct jpeg_inverse_dct *) idct;
  idct->pub.start_pass = start_pass;

  for (ci = 0, compptr = cinfo->comp_info; ci < cinfo->num_components;
       ci++, compptr++) {
    /* Allocate and pre-zero a multiplier table for each component */
    compptr->dct_table =
      (*cinfo->mem->alloc_small) ((j_common_ptr) cinfo, JPOOL_IMAGE,
				  SIZEOF(multiplier_table));
    MEMZERO(compptr->dct_table, SIZEOF(multiplier_table));
    /* Mark multiplier table not yet set up for any method */
    idct->cur_method[ci] = -1;
  }
}